

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O3

void assert_same_file(char *file1,char *file2,bool expected)

{
  bool bVar1;
  size_t sVar2;
  ostream *poVar3;
  char *pcVar4;
  
  bVar1 = QUtil::same_file(file1,file2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"file1: -",8);
  if (file1 == (char *)0x0) {
    file1 = "(null)";
  }
  sVar2 = strlen(file1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,file1,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-, file2: -",0xb);
  if (file2 == (char *)0x0) {
    file2 = "(null)";
  }
  sVar2 = strlen(file2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,file2,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-; same: ",9);
  poVar3 = std::ostream::_M_insert<bool>(true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
  pcVar4 = "PASS";
  if (bVar1 != expected) {
    pcVar4 = "FAIL";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void
assert_same_file(char const* file1, char const* file2, bool expected)
{
    bool actual = QUtil::same_file(file1, file2);
    std::cout << "file1: -" << (file1 ? file1 : "(null)") << "-, file2: -"
              << (file2 ? file2 : "(null)") << "-; same: " << actual << ": "
              << ((actual == expected) ? "PASS" : "FAIL") << std::endl;
}